

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_exttime(char *p,rar *rar,char *endp)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  tm *__tp;
  uint uVar5;
  time_t *ptVar6;
  int *piVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  time_t t;
  time_t local_88;
  uint local_7c;
  time_t *local_78;
  long *local_70;
  time_t *local_68;
  long *local_60;
  time_t *local_58;
  long *local_50;
  time_t *local_48;
  long *local_40;
  int *local_38;
  
  piVar7 = (int *)(p + 2);
  iVar13 = -1;
  if (piVar7 <= endp) {
    uVar2 = *(ushort *)p;
    local_78 = &rar->mtime;
    local_58 = &rar->atime;
    local_60 = &rar->ansec;
    local_48 = &rar->ctime;
    local_50 = &rar->cnsec;
    local_68 = &rar->arctime;
    local_70 = &rar->arcnsec;
    local_40 = &rar->mnsec;
    local_7c = (uint)(uVar2 >> 0xc);
    iVar13 = 3;
    local_38 = (int *)endp;
    do {
      local_88 = 0;
      if (iVar13 == 3) {
        local_88 = *local_78;
        if ((short)uVar2 < 0) {
          uVar10 = local_7c;
          if (local_88 == 0) goto LAB_0020e8da;
LAB_0020e8f2:
          uVar5 = uVar10 & 3;
          piVar1 = (int *)((long)piVar7 + (ulong)uVar5);
          if (endp < piVar1) {
            return -1;
          }
          if ((ulong)uVar5 == 0) {
            uVar11 = 0;
          }
          else {
            lVar8 = 0;
            uVar12 = 0;
            do {
              uVar11 = (uint)(uVar12 >> 8) | (int)*(char *)((long)piVar7 + lVar8) << 0x10;
              uVar12 = (ulong)uVar11;
              lVar8 = lVar8 + 1;
            } while (uVar5 != (uint)lVar8);
            uVar11 = uVar11 / 10000000;
            piVar7 = piVar1;
          }
          __tp = localtime(&local_88);
          iVar3 = __tp->tm_sec;
          if ((uVar10 & 4) != 0) {
            __tp->tm_sec = iVar3 + 1;
            local_88 = mktime(__tp);
          }
          ptVar6 = local_78;
          plVar9 = local_40;
          if (((iVar13 != 3) && (ptVar6 = local_48, plVar9 = local_50, iVar13 != 2)) &&
             (ptVar6 = local_58, plVar9 = local_60, iVar13 != 1)) {
            ptVar6 = local_68;
            plVar9 = local_70;
          }
          *ptVar6 = local_88;
          *plVar9 = (ulong)(iVar3 + uVar11);
          endp = (char *)local_38;
        }
      }
      else {
        uVar4 = uVar2 >> ((char)iVar13 * '\x04' & 0x1fU);
        uVar10 = (uint)uVar4;
        if ((uVar4 & 8) != 0) {
LAB_0020e8da:
          if (endp < piVar7 + 1) {
            return -1;
          }
          local_88 = get_time(*piVar7);
          piVar7 = piVar7 + 1;
          goto LAB_0020e8f2;
        }
      }
      bVar14 = iVar13 != 0;
      iVar13 = iVar13 + -1;
    } while (bVar14);
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = ((*p) << 16) | (rem >> 8);
        p++;
      }
      tm = localtime(&t);
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}